

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellBST.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementShellBST::ComputeKRMmatricesGlobal
          (ChElementShellBST *this,ChMatrixRef *H,double Kfactor,double Rfactor,double Mfactor)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ChElementShellBST *pCVar3;
  DenseBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
  *this_00;
  int iVar4;
  Scalar *pSVar5;
  Scalar *pSVar6;
  ChStateDelta *in_RCX;
  ChStateDelta *state_w_00;
  int i_1;
  int i;
  long lVar7;
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  int mrows_w;
  ChElementShellBST *local_180;
  DenseBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
  *local_178;
  double local_170;
  ChState state_x_inc;
  ChMatrixDynamic<> K;
  ChVectorDynamic<> Q0;
  double Kfactor_local;
  ChVectorDynamic<> Jcolumn;
  ChVectorDynamic<> Q1;
  ChStateDelta state_delta;
  ChState state_x;
  double local_c8;
  double Rfactor_local;
  ChStateDelta state_w;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
  local_a0;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  local_70;
  
  lVar7 = (H->
          super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
          ).
          super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
          .
          super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
          .m_rows.m_value;
  local_170 = Mfactor;
  Kfactor_local = Kfactor;
  Rfactor_local = Rfactor;
  iVar4 = (*(this->super_ChElementShell).super_ChElementGeneric.super_ChElementBase.
            _vptr_ChElementBase[3])();
  if (lVar7 == iVar4) {
    lVar7 = (H->
            super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
            ).
            super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
            .
            super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
            .m_cols.m_value;
    iVar4 = (*(this->super_ChElementShell).super_ChElementGeneric.super_ChElementBase.
              _vptr_ChElementBase[3])(this);
    if (lVar7 == iVar4) {
      local_178 = (DenseBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                   *)H;
      iVar4 = (*(this->super_ChElementShell).super_ChElementGeneric.super_ChElementBase.
                _vptr_ChElementBase[0x1b])(this);
      ChState::ChState(&state_x,(long)iVar4,(ChIntegrable *)0x0);
      local_180 = this;
      iVar4 = (*(this->super_ChElementShell).super_ChElementGeneric.super_ChElementBase.
                _vptr_ChElementBase[0x1c])(this);
      ChStateDelta::ChStateDelta(&state_w,(long)iVar4,(ChIntegrable *)0x0);
      pCVar3 = local_180;
      (*(local_180->super_ChElementShell).super_ChElementGeneric.super_ChElementBase.
        _vptr_ChElementBase[0x1d])(local_180,0,&state_x);
      (*(pCVar3->super_ChElementShell).super_ChElementGeneric.super_ChElementBase.
        _vptr_ChElementBase[0x1e])(pCVar3,0,&state_w);
      mrows_w = (*(pCVar3->super_ChElementShell).super_ChElementGeneric.super_ChElementBase.
                  _vptr_ChElementBase[0x1c])(pCVar3);
      iVar4 = (*(pCVar3->super_ChElementShell).super_ChElementGeneric.super_ChElementBase.
                _vptr_ChElementBase[0x1b])(pCVar3);
      Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>(&Q0,&mrows_w);
      ComputeInternalForces_impl(local_180,&Q0,&state_x,in_RCX,false);
      Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>(&Q1,&mrows_w);
      Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>(&Jcolumn,&mrows_w);
      if ((Kfactor_local != 0.0) || (NAN(Kfactor_local))) {
        Eigen::Matrix<double,-1,-1,1,-1,-1>::Matrix<int,int>
                  ((Matrix<double,_1,_1,1,_1,_1> *)&K,&mrows_w,&mrows_w);
        ChState::ChState(&state_x_inc,(long)iVar4,(ChIntegrable *)0x0);
        ChStateDelta::ChStateDelta(&state_delta,(long)mrows_w,(ChIntegrable *)0x0);
        Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero
                  ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&state_delta,
                   (long)mrows_w);
        state_delta.integrable = (ChIntegrable *)0x0;
        for (lVar7 = 0; lVar7 < mrows_w; lVar7 = lVar7 + 1) {
          pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                             ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                              &state_delta,lVar7);
          *pSVar5 = *pSVar5 + 1e-10;
          state_w_00 = (ChStateDelta *)&state_x;
          (*(local_180->super_ChElementShell).super_ChElementGeneric.super_ChElementBase.
            _vptr_ChElementBase[0x1f])(local_180,0,&state_x_inc,state_w_00,0,&state_delta);
          Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero
                    ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&Q1,(long)mrows_w);
          ComputeInternalForces_impl(local_180,&Q1,&state_x_inc,state_w_00,false);
          pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                             ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                              &state_delta,lVar7);
          *pSVar5 = *pSVar5 + -1e-10;
          Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator-
                    ((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                      *)&local_a0,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&Q1,
                     (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&Q0);
          local_c8 = -10000000000.0;
          Eigen::
          MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,-1,1,0,-1,1>const,Eigen::Matrix<double,-1,1,0,-1,1>const>>
          ::operator*(&local_70,
                      (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                       *)&local_a0,&local_c8);
          Eigen::internal::
          call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
                    (&Jcolumn,&local_70);
          Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_-1,_1,_false>::Block
                    ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,__1,_1,_false> *)&local_70,&K,
                     lVar7);
          Eigen::internal::
          call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,_1,1,false>,Eigen::Matrix<double,_1,1,0,_1,1>>
                    ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,__1,_1,_false> *)&local_70,
                     &Jcolumn);
        }
        Eigen::operator*(&local_a0,&Kfactor_local,(StorageBaseType *)&K);
        in_RCX = (ChStateDelta *)0x0;
        Eigen::DenseBase<Eigen::Ref<Eigen::Matrix<double,-1,-1,1,-1,-1>,0,Eigen::OuterStride<-1>>>::
        block<int,int>((Type *)&local_70,local_178,0,0,mrows_w,mrows_w);
        Eigen::internal::
        call_assignment<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::OuterStride<_1>>,_1,_1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,1,_1,_1>const>const,Eigen::Matrix<double,_1,_1,1,_1,_1>const>>
                  ((Block<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,__1,_false>
                    *)&local_70,&local_a0);
        Eigen::internal::handmade_aligned_free
                  (state_delta.super_ChVectorDynamic<double>.
                   super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
        Eigen::internal::handmade_aligned_free
                  (state_x_inc.super_ChVectorDynamic<double>.
                   super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
        Eigen::internal::handmade_aligned_free
                  (K.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
                   m_data);
      }
      else {
        Eigen::
        DenseBase<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>_>
        ::setZero(local_178);
      }
      if ((Rfactor != 0.0) || (NAN(Rfactor))) {
        ChStateDelta::ChStateDelta((ChStateDelta *)&K,(long)mrows_w,(ChIntegrable *)0x0);
        ChStateDelta::operator=((ChStateDelta *)&K,&state_w);
        Eigen::Matrix<double,-1,-1,1,-1,-1>::Matrix<int,int>
                  ((Matrix<double,_1,_1,1,_1,_1> *)&state_x_inc,&mrows_w,&mrows_w);
        for (lVar7 = 0; lVar7 < mrows_w; lVar7 = lVar7 + 1) {
          Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero
                    ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&Q1,(long)mrows_w);
          pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                             ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&K,lVar7
                             );
          *pSVar5 = *pSVar5 + 1e-10;
          ComputeInternalForces_impl(local_180,&Q1,&state_x,in_RCX,false);
          pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                             ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&K,lVar7
                             );
          *pSVar5 = *pSVar5 + -1e-10;
          Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator-
                    ((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                      *)&local_a0,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&Q1,
                     (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&Q0);
          state_delta.super_ChVectorDynamic<double>.
          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
               (double *)0xc202a05f20000000;
          Eigen::
          MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,-1,1,0,-1,1>const,Eigen::Matrix<double,-1,1,0,-1,1>const>>
          ::operator*(&local_70,
                      (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                       *)&local_a0,(double *)&state_delta);
          Eigen::internal::
          call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
                    (&Jcolumn,&local_70);
          Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_-1,_1,_false>::Block
                    ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,__1,_1,_false> *)&local_70,
                     (Matrix<double,__1,__1,_1,__1,__1> *)&state_x_inc,lVar7);
          Eigen::internal::
          call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,_1,1,false>,Eigen::Matrix<double,_1,1,0,_1,1>>
                    ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,__1,_1,_false> *)&local_70,
                     &Jcolumn);
        }
        Eigen::operator*(&local_a0,&Rfactor_local,(StorageBaseType *)&state_x_inc);
        Eigen::DenseBase<Eigen::Ref<Eigen::Matrix<double,-1,-1,1,-1,-1>,0,Eigen::OuterStride<-1>>>::
        block<int,int>((Type *)&local_70,local_178,0,0,mrows_w,mrows_w);
        Eigen::
        MatrixBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,-1,-1,1,-1,-1>,0,Eigen::OuterStride<-1>>,-1,-1,false>>
        ::operator+=((MatrixBase<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,_1,1,_1,_1>,0,Eigen::OuterStride<_1>>,_1,_1,false>>
                      *)&local_70,
                     (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>
                      *)&local_a0);
        Eigen::internal::handmade_aligned_free
                  (state_x_inc.super_ChVectorDynamic<double>.
                   super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
        Eigen::internal::handmade_aligned_free
                  (K.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
                   m_data);
      }
      pCVar3 = local_180;
      if ((local_170 != 0.0) || (NAN(local_170))) {
        dVar8 = local_170;
        (*(local_180->super_ChElementShell).super_ChElementGeneric.super_ChElementBase.
          _vptr_ChElementBase[0x28])(local_180);
        this_00 = local_178;
        local_180 = (ChElementShellBST *)
                    (dVar8 * pCVar3->tot_thickness * pCVar3->area * 0.3333333333333333);
        lVar7 = 2;
        while (lVar7 != 0xb) {
          pSVar6 = Eigen::
                   DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_1>
                   ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                                 *)this_00,lVar7 + -2,lVar7 + -2);
          auVar12._8_8_ = 0;
          auVar12._0_8_ = local_170;
          auVar9._8_8_ = 0;
          auVar9._0_8_ = *pSVar6;
          auVar1._8_8_ = 0;
          auVar1._0_8_ = local_180;
          auVar1 = vfmadd231sd_fma(auVar9,auVar12,auVar1);
          *pSVar6 = auVar1._0_8_;
          pSVar6 = Eigen::
                   DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_1>
                   ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                                 *)this_00,lVar7 + -1,lVar7 + -1);
          auVar13._8_8_ = 0;
          auVar13._0_8_ = local_170;
          auVar10._8_8_ = 0;
          auVar10._0_8_ = *pSVar6;
          auVar2._8_8_ = 0;
          auVar2._0_8_ = local_180;
          auVar1 = vfmadd231sd_fma(auVar10,auVar13,auVar2);
          *pSVar6 = auVar1._0_8_;
          pSVar6 = Eigen::
                   DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_1>
                   ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                                 *)this_00,lVar7,lVar7);
          auVar15._8_8_ = 0;
          auVar15._0_8_ = local_170;
          auVar11._8_8_ = 0;
          auVar11._0_8_ = *pSVar6;
          auVar14._8_8_ = 0;
          auVar14._0_8_ = local_180;
          lVar7 = lVar7 + 3;
          auVar1 = vfmadd231sd_fma(auVar11,auVar15,auVar14);
          *pSVar6 = auVar1._0_8_;
        }
      }
      Eigen::internal::handmade_aligned_free
                (Jcolumn.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                 m_data);
      Eigen::internal::handmade_aligned_free
                (Q1.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data)
      ;
      Eigen::internal::handmade_aligned_free
                (Q0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data)
      ;
      Eigen::internal::handmade_aligned_free
                (state_w.super_ChVectorDynamic<double>.
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
      Eigen::internal::handmade_aligned_free
                (state_x.super_ChVectorDynamic<double>.
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
      return;
    }
  }
  __assert_fail("(H.rows() == this->GetNdofs() ) && (H.cols() == this->GetNdofs())",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/fea/ChElementShellBST.cpp"
                ,0x125,
                "virtual void chrono::fea::ChElementShellBST::ComputeKRMmatricesGlobal(ChMatrixRef, double, double, double)"
               );
}

Assistant:

void ChElementShellBST::ComputeKRMmatricesGlobal(ChMatrixRef H, double Kfactor, double Rfactor, double Mfactor) {

	assert((H.rows() == this->GetNdofs() ) && (H.cols() == this->GetNdofs()));

	// BRUTE FORCE METHOD: USE NUMERICAL DIFFERENTIATION!

	//
	// The K stiffness matrix of this element:  
	//

	ChState      state_x(this->LoadableGet_ndof_x(), nullptr);
	ChStateDelta state_w(this->LoadableGet_ndof_w(), nullptr);
	this->LoadableGetStateBlock_x(0, state_x);
	this->LoadableGetStateBlock_w(0, state_w);

	double Delta = 1e-10;

	int mrows_w = this->LoadableGet_ndof_w();
	int mrows_x = this->LoadableGet_ndof_x();

	
	// compute Q at current speed & position, x_0, v_0
	ChVectorDynamic<> Q0(mrows_w);
	this->ComputeInternalForces_impl(Q0, state_x, state_w, true);     // Q0 = Q(x, v)

	ChVectorDynamic<> Q1(mrows_w);
	ChVectorDynamic<> Jcolumn(mrows_w);
	

	if (Kfactor) {
		ChMatrixDynamic<> K(mrows_w, mrows_w);

		ChState       state_x_inc(mrows_x, nullptr);
		ChStateDelta  state_delta(mrows_w, nullptr);

		// Compute K=-dQ(x,v)/dx by backward differentiation
		state_delta.setZero(mrows_w, nullptr);

		for (int i = 0; i < mrows_w; ++i) {
			state_delta(i) += Delta;
			this->LoadableStateIncrement(0, state_x_inc, state_x, 0, state_delta);  // exponential, usually state_x_inc(i) = state_x(i) + Delta;

			Q1.setZero(mrows_w);
			this->ComputeInternalForces_impl(Q1, state_x_inc, state_w, true);   // Q1 = Q(x+Dx, v)
			state_delta(i) -= Delta;

			Jcolumn = (Q1 - Q0) * (-1.0 / Delta);   // - sign because K=-dQ/dx
			K.col(i) = Jcolumn;
		}

		// finally, store K into H:
		H.block(0, 0, mrows_w, mrows_w) = Kfactor * K;
	}
	else
		H.setZero();


	//
	// The R damping matrix of this element: 
	//

	if (Rfactor) {
		// Compute R=-dQ(x,v)/dv by backward differentiation
		//if (this->section->GetDamping()) {
		ChStateDelta  state_w_inc(mrows_w, nullptr);
		state_w_inc = state_w;
		ChMatrixDynamic<> R(mrows_w, mrows_w);

		for (int i = 0; i < mrows_w; ++i) {
			Q1.setZero(mrows_w);

			state_w_inc(i) += Delta;
			this->ComputeInternalForces_impl(Q1, state_x, state_w_inc, true); // Q1 = Q(x, v+Dv)
			state_w_inc(i) -= Delta;

			Jcolumn = (Q1 - Q0) * (-1.0 / Delta);   // - sign because R=-dQ/dv
			R.col(i) = Jcolumn;
		}

		H.block(0, 0, mrows_w, mrows_w) += Rfactor * R;
	}

	//
	// The M mass matrix of this element: (lumped version)
	//

	if (Mfactor) {
		// loop over all layers, to compute total "mass per area" = sum(rho_i*thickness_i) = average_rho * sum(thickness_i)
		double avg_density = this->GetDensity();
		double mass_per_area = avg_density * tot_thickness;

		// Heuristic, simplified 'lumped' mass matrix to central three nodes.
		// This is simpler than the stiffness-consistent mass matrix that would require
		// integration over gauss points.

		double nodemass = (1.0 / 3.0) * (this->area * mass_per_area);

		for (int n = 0; n < 3; n++) {

			int node_off = n * 3;
			H(node_off + 0, node_off + 0) += Mfactor * nodemass;
			H(node_off + 1, node_off + 1) += Mfactor * nodemass;
			H(node_off + 2, node_off + 2) += Mfactor * nodemass;

		}
	}
}